

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall c4::yml::Tree::parent(Tree *this,size_t node)

{
  NodeData *pNVar1;
  size_t in_stack_00000038;
  Tree *in_stack_00000040;
  
  pNVar1 = _p(in_stack_00000040,in_stack_00000038);
  return pNVar1->m_parent;
}

Assistant:

size_t prev_sibling(size_t node) const { return _p(node)->m_prev_sibling; }